

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss_test.cc
# Opt level: O3

void __thiscall HRSS_Basic_Test::TestBody(HRSS_Basic_Test *this)

{
  uint8_t uVar1;
  internal iVar2;
  int iVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer message;
  char *in_R9;
  pointer *__ptr;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar38;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  uint8_t shared_key2 [32];
  uint8_t shared_key [32];
  uint8_t encap_entropy [1400];
  uint8_t generate_key_entropy [1432];
  uint8_t ciphertext [1138];
  HRSS_public_key pub2;
  uint8_t pub_bytes [1138];
  HRSS_public_key pub;
  HRSS_private_key priv;
  undefined1 local_26e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_26d8;
  Bytes local_26d0;
  undefined1 local_26c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_26b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_26b0;
  AssertHelper local_26a0;
  string local_2698;
  internal local_2678 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2670 [3];
  internal local_2658;
  char acStack_2657 [7];
  undefined8 local_2650;
  uint8_t local_20d8 [1440];
  undefined1 local_1b38 [1152];
  undefined1 local_16b8 [1424];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1128 [143];
  HRSS_public_key local_cb0;
  HRSS_private_key local_720;
  
  lVar4 = 0;
  auVar29 = _DAT_00552ac0;
  auVar6 = _DAT_00552ad0;
  auVar8 = _DAT_00552ae0;
  auVar10 = _DAT_00552af0;
  auVar12 = _DAT_00552b00;
  auVar14 = _DAT_00552b10;
  auVar16 = _DAT_00552b20;
  auVar18 = _DAT_00539e60;
  do {
    auVar20 = auVar18 ^ _DAT_00539e70;
    iVar3 = auVar20._0_4_;
    iVar38 = auVar20._8_4_;
    auVar39._4_4_ = iVar3;
    auVar39._0_4_ = iVar3;
    auVar39._8_4_ = iVar38;
    auVar39._12_4_ = iVar38;
    auVar55._0_4_ = -(uint)(iVar3 < -0x7ffffa68);
    auVar55._4_4_ = -(uint)(iVar3 < -0x7ffffa68);
    auVar55._8_4_ = -(uint)(iVar38 < -0x7ffffa68);
    auVar55._12_4_ = -(uint)(iVar38 < -0x7ffffa68);
    auVar21._0_4_ = -(uint)(auVar20._4_4_ == -0x80000000);
    auVar21._4_4_ = -(uint)(auVar20._4_4_ == -0x80000000);
    auVar21._8_4_ = -(uint)(auVar20._12_4_ == -0x80000000);
    auVar21._12_4_ = -(uint)(auVar20._12_4_ == -0x80000000);
    auVar21 = auVar21 & auVar55;
    auVar20 = pshuflw(auVar39,auVar21,0xe8);
    auVar20 = packssdw(auVar20,auVar20);
    uVar1 = (uint8_t)lVar4;
    if ((auVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_20d8[lVar4] = uVar1;
    }
    auVar20 = packssdw(auVar21,auVar21);
    auVar20 = packssdw(auVar20,auVar20);
    auVar20 = packsswb(auVar20,auVar20);
    if ((auVar20._0_4_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 1] = uVar1 + '\x01';
    }
    auVar20 = auVar16 ^ _DAT_00539e70;
    iVar3 = auVar20._0_4_;
    iVar38 = auVar20._8_4_;
    auVar40._4_4_ = iVar3;
    auVar40._0_4_ = iVar3;
    auVar40._8_4_ = iVar38;
    auVar40._12_4_ = iVar38;
    auVar56._0_4_ = -(uint)(iVar3 < -0x7ffffa68);
    auVar56._4_4_ = -(uint)(iVar3 < -0x7ffffa68);
    auVar56._8_4_ = -(uint)(iVar38 < -0x7ffffa68);
    auVar56._12_4_ = -(uint)(iVar38 < -0x7ffffa68);
    auVar22._0_4_ = -(uint)(auVar20._4_4_ == -0x80000000);
    auVar22._4_4_ = -(uint)(auVar20._4_4_ == -0x80000000);
    auVar22._8_4_ = -(uint)(auVar20._12_4_ == -0x80000000);
    auVar22._12_4_ = -(uint)(auVar20._12_4_ == -0x80000000);
    auVar22 = auVar22 & auVar56;
    auVar20 = packssdw(auVar40,auVar22);
    auVar20 = packssdw(auVar20,auVar20);
    auVar20 = packsswb(auVar20,auVar20);
    if ((auVar20._0_4_ >> 0x10 & 1) != 0) {
      local_20d8[lVar4 + 2] = uVar1 + '\x02';
    }
    auVar20 = pshufhw(auVar22,auVar22,0x84);
    auVar20 = packssdw(auVar20,auVar20);
    auVar20 = packsswb(auVar20,auVar20);
    if ((auVar20._0_4_ >> 0x18 & 1) != 0) {
      local_20d8[lVar4 + 3] = uVar1 + '\x03';
    }
    auVar20 = auVar14 ^ _DAT_00539e70;
    iVar3 = auVar20._0_4_;
    iVar38 = auVar20._8_4_;
    auVar41._4_4_ = iVar3;
    auVar41._0_4_ = iVar3;
    auVar41._8_4_ = iVar38;
    auVar41._12_4_ = iVar38;
    auVar57._0_4_ = -(uint)(iVar3 < -0x7ffffa68);
    auVar57._4_4_ = -(uint)(iVar3 < -0x7ffffa68);
    auVar57._8_4_ = -(uint)(iVar38 < -0x7ffffa68);
    auVar57._12_4_ = -(uint)(iVar38 < -0x7ffffa68);
    auVar23._0_4_ = -(uint)(auVar20._4_4_ == -0x80000000);
    auVar23._4_4_ = -(uint)(auVar20._4_4_ == -0x80000000);
    auVar23._8_4_ = -(uint)(auVar20._12_4_ == -0x80000000);
    auVar23._12_4_ = -(uint)(auVar20._12_4_ == -0x80000000);
    auVar23 = auVar23 & auVar57;
    auVar20 = pshuflw(auVar41,auVar23,0xe8);
    auVar20 = packssdw(auVar20,auVar20);
    auVar20 = packsswb(auVar20,auVar20);
    if ((auVar20 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 4] = uVar1 + '\x04';
    }
    auVar20 = packssdw(auVar23,auVar23);
    auVar20 = packssdw(auVar20,auVar20);
    auVar20 = packsswb(auVar20,auVar20);
    if ((auVar20._4_2_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 5] = uVar1 + '\x05';
    }
    auVar20 = auVar12 ^ _DAT_00539e70;
    iVar3 = auVar20._0_4_;
    iVar38 = auVar20._8_4_;
    auVar42._4_4_ = iVar3;
    auVar42._0_4_ = iVar3;
    auVar42._8_4_ = iVar38;
    auVar42._12_4_ = iVar38;
    auVar58._0_4_ = -(uint)(iVar3 < -0x7ffffa68);
    auVar58._4_4_ = -(uint)(iVar3 < -0x7ffffa68);
    auVar58._8_4_ = -(uint)(iVar38 < -0x7ffffa68);
    auVar58._12_4_ = -(uint)(iVar38 < -0x7ffffa68);
    auVar24._0_4_ = -(uint)(auVar20._4_4_ == -0x80000000);
    auVar24._4_4_ = -(uint)(auVar20._4_4_ == -0x80000000);
    auVar24._8_4_ = -(uint)(auVar20._12_4_ == -0x80000000);
    auVar24._12_4_ = -(uint)(auVar20._12_4_ == -0x80000000);
    auVar24 = auVar24 & auVar58;
    auVar20 = packssdw(auVar42,auVar24);
    auVar20 = packssdw(auVar20,auVar20);
    auVar20 = packsswb(auVar20,auVar20);
    if ((auVar20 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 6] = uVar1 + '\x06';
    }
    auVar20 = pshufhw(auVar24,auVar24,0x84);
    auVar20 = packssdw(auVar20,auVar20);
    auVar20 = packsswb(auVar20,auVar20);
    if ((auVar20._6_2_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 7] = uVar1 + '\a';
    }
    auVar20 = auVar10 ^ _DAT_00539e70;
    iVar3 = auVar20._0_4_;
    iVar38 = auVar20._8_4_;
    auVar43._4_4_ = iVar3;
    auVar43._0_4_ = iVar3;
    auVar43._8_4_ = iVar38;
    auVar43._12_4_ = iVar38;
    auVar59._0_4_ = -(uint)(iVar3 < -0x7ffffa68);
    auVar59._4_4_ = -(uint)(iVar3 < -0x7ffffa68);
    auVar59._8_4_ = -(uint)(iVar38 < -0x7ffffa68);
    auVar59._12_4_ = -(uint)(iVar38 < -0x7ffffa68);
    auVar25._0_4_ = -(uint)(auVar20._4_4_ == -0x80000000);
    auVar25._4_4_ = -(uint)(auVar20._4_4_ == -0x80000000);
    auVar25._8_4_ = -(uint)(auVar20._12_4_ == -0x80000000);
    auVar25._12_4_ = -(uint)(auVar20._12_4_ == -0x80000000);
    auVar25 = auVar25 & auVar59;
    auVar20 = pshuflw(auVar43,auVar25,0xe8);
    auVar20 = packssdw(auVar20,auVar20);
    auVar20 = packsswb(auVar20,auVar20);
    if ((auVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 8] = uVar1 + '\b';
    }
    auVar20 = packssdw(auVar25,auVar25);
    auVar20 = packssdw(auVar20,auVar20);
    auVar20 = packsswb(auVar20,auVar20);
    if ((auVar20._8_2_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 9] = uVar1 + '\t';
    }
    auVar20 = auVar8 ^ _DAT_00539e70;
    iVar3 = auVar20._0_4_;
    iVar38 = auVar20._8_4_;
    auVar44._4_4_ = iVar3;
    auVar44._0_4_ = iVar3;
    auVar44._8_4_ = iVar38;
    auVar44._12_4_ = iVar38;
    auVar60._0_4_ = -(uint)(iVar3 < -0x7ffffa68);
    auVar60._4_4_ = -(uint)(iVar3 < -0x7ffffa68);
    auVar60._8_4_ = -(uint)(iVar38 < -0x7ffffa68);
    auVar60._12_4_ = -(uint)(iVar38 < -0x7ffffa68);
    auVar26._0_4_ = -(uint)(auVar20._4_4_ == -0x80000000);
    auVar26._4_4_ = -(uint)(auVar20._4_4_ == -0x80000000);
    auVar26._8_4_ = -(uint)(auVar20._12_4_ == -0x80000000);
    auVar26._12_4_ = -(uint)(auVar20._12_4_ == -0x80000000);
    auVar26 = auVar26 & auVar60;
    auVar20 = packssdw(auVar44,auVar26);
    auVar20 = packssdw(auVar20,auVar20);
    auVar20 = packsswb(auVar20,auVar20);
    if ((auVar20 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 10] = uVar1 + '\n';
    }
    auVar20 = pshufhw(auVar26,auVar26,0x84);
    auVar20 = packssdw(auVar20,auVar20);
    auVar20 = packsswb(auVar20,auVar20);
    if ((auVar20._10_2_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 0xb] = uVar1 + '\v';
    }
    auVar20 = auVar6 ^ _DAT_00539e70;
    iVar3 = auVar20._0_4_;
    iVar38 = auVar20._8_4_;
    auVar45._4_4_ = iVar3;
    auVar45._0_4_ = iVar3;
    auVar45._8_4_ = iVar38;
    auVar45._12_4_ = iVar38;
    auVar61._0_4_ = -(uint)(iVar3 < -0x7ffffa68);
    auVar61._4_4_ = -(uint)(iVar3 < -0x7ffffa68);
    auVar61._8_4_ = -(uint)(iVar38 < -0x7ffffa68);
    auVar61._12_4_ = -(uint)(iVar38 < -0x7ffffa68);
    auVar27._0_4_ = -(uint)(auVar20._4_4_ == -0x80000000);
    auVar27._4_4_ = -(uint)(auVar20._4_4_ == -0x80000000);
    auVar27._8_4_ = -(uint)(auVar20._12_4_ == -0x80000000);
    auVar27._12_4_ = -(uint)(auVar20._12_4_ == -0x80000000);
    auVar27 = auVar27 & auVar61;
    auVar20 = pshuflw(auVar45,auVar27,0xe8);
    auVar20 = packssdw(auVar20,auVar20);
    auVar20 = packsswb(auVar20,auVar20);
    if ((auVar20 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 0xc] = uVar1 + '\f';
    }
    auVar20 = packssdw(auVar27,auVar27);
    auVar20 = packssdw(auVar20,auVar20);
    auVar20 = packsswb(auVar20,auVar20);
    if ((auVar20._12_2_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 0xd] = uVar1 + '\r';
    }
    auVar20 = auVar29 ^ _DAT_00539e70;
    iVar3 = auVar20._0_4_;
    iVar38 = auVar20._8_4_;
    auVar46._4_4_ = iVar3;
    auVar46._0_4_ = iVar3;
    auVar46._8_4_ = iVar38;
    auVar46._12_4_ = iVar38;
    auVar62._0_4_ = -(uint)(iVar3 < -0x7ffffa68);
    auVar62._4_4_ = -(uint)(iVar3 < -0x7ffffa68);
    auVar62._8_4_ = -(uint)(iVar38 < -0x7ffffa68);
    auVar62._12_4_ = -(uint)(iVar38 < -0x7ffffa68);
    auVar28._0_4_ = -(uint)(auVar20._4_4_ == -0x80000000);
    auVar28._4_4_ = -(uint)(auVar20._4_4_ == -0x80000000);
    auVar28._8_4_ = -(uint)(auVar20._12_4_ == -0x80000000);
    auVar28._12_4_ = -(uint)(auVar20._12_4_ == -0x80000000);
    auVar28 = auVar28 & auVar62;
    auVar20 = packssdw(auVar46,auVar28);
    auVar20 = packssdw(auVar20,auVar20);
    auVar20 = packsswb(auVar20,auVar20);
    if ((auVar20 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      local_20d8[lVar4 + 0xe] = uVar1 + '\x0e';
    }
    auVar20 = pshufhw(auVar28,auVar28,0x84);
    auVar20 = packssdw(auVar20,auVar20);
    auVar20 = packsswb(auVar20,auVar20);
    if ((auVar20._14_2_ >> 8 & 1) != 0) {
      local_20d8[lVar4 + 0xf] = uVar1 + '\x0f';
    }
    lVar4 = lVar4 + 0x10;
    lVar5 = auVar18._8_8_;
    auVar18._0_8_ = auVar18._0_8_ + 0x10;
    auVar18._8_8_ = lVar5 + 0x10;
    lVar5 = auVar16._8_8_;
    auVar16._0_8_ = auVar16._0_8_ + 0x10;
    auVar16._8_8_ = lVar5 + 0x10;
    lVar5 = auVar14._8_8_;
    auVar14._0_8_ = auVar14._0_8_ + 0x10;
    auVar14._8_8_ = lVar5 + 0x10;
    lVar5 = auVar12._8_8_;
    auVar12._0_8_ = auVar12._0_8_ + 0x10;
    auVar12._8_8_ = lVar5 + 0x10;
    lVar5 = auVar10._8_8_;
    auVar10._0_8_ = auVar10._0_8_ + 0x10;
    auVar10._8_8_ = lVar5 + 0x10;
    lVar5 = auVar8._8_8_;
    auVar8._0_8_ = auVar8._0_8_ + 0x10;
    auVar8._8_8_ = lVar5 + 0x10;
    lVar5 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 0x10;
    auVar6._8_8_ = lVar5 + 0x10;
    lVar5 = auVar29._8_8_;
    auVar29._0_8_ = auVar29._0_8_ + 0x10;
    auVar29._8_8_ = lVar5 + 0x10;
  } while (lVar4 != 0x5a0);
  iVar3 = HRSS_generate_key(&local_cb0,&local_720,local_20d8);
  local_2658 = (internal)(iVar3 != 0);
  local_2650 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar3 == 0) {
    testing::Message::Message((Message *)local_1128);
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_2650;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_16b8,&local_2658,
               (AssertionResult *)"HRSS_generate_key(&pub, &priv, generate_key_entropy)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1b38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
               ,0x92,(char *)local_16b8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1b38,(Message *)local_1128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b38);
    if ((undefined1 *)local_16b8._0_8_ != local_16b8 + 0x10) {
      operator_delete((void *)local_16b8._0_8_,local_16b8._16_8_ + 1);
    }
    __ptr_00 = local_2650;
    if (local_1128[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1128[0]._M_head_impl + 8))();
      __ptr_00 = local_2650;
    }
  }
  else {
    lVar4 = 0;
    auVar20 = _DAT_00552ac0;
    auVar7 = _DAT_00552ad0;
    auVar9 = _DAT_00552ae0;
    auVar11 = _DAT_00552af0;
    auVar13 = _DAT_00552b00;
    auVar15 = _DAT_00552b10;
    auVar17 = _DAT_00552b20;
    auVar19 = _DAT_00539e60;
    do {
      auVar29 = auVar19 ^ _DAT_00539e70;
      iVar3 = auVar29._0_4_;
      iVar38 = auVar29._8_4_;
      auVar47._4_4_ = iVar3;
      auVar47._0_4_ = iVar3;
      auVar47._8_4_ = iVar38;
      auVar47._12_4_ = iVar38;
      auVar63._0_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar63._4_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar63._8_4_ = -(uint)(iVar38 < -0x7ffffa88);
      auVar63._12_4_ = -(uint)(iVar38 < -0x7ffffa88);
      auVar30._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar30._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar30._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar30._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar30 = auVar30 & auVar63;
      auVar29 = pshuflw(auVar47,auVar30,0xe8);
      auVar29 = packssdw(auVar29,auVar29);
      iVar2 = SUB81(lVar4,0);
      if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (&local_2658)[lVar4] = iVar2;
      }
      auVar29 = packssdw(auVar30,auVar30);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29._0_4_ >> 8 & 1) != 0) {
        acStack_2657[lVar4] = (char)iVar2 + '\x01';
      }
      auVar29 = auVar17 ^ _DAT_00539e70;
      iVar3 = auVar29._0_4_;
      iVar38 = auVar29._8_4_;
      auVar48._4_4_ = iVar3;
      auVar48._0_4_ = iVar3;
      auVar48._8_4_ = iVar38;
      auVar48._12_4_ = iVar38;
      auVar64._0_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar64._4_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar64._8_4_ = -(uint)(iVar38 < -0x7ffffa88);
      auVar64._12_4_ = -(uint)(iVar38 < -0x7ffffa88);
      auVar31._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar31._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar31._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar31._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar31 = auVar31 & auVar64;
      auVar29 = packssdw(auVar48,auVar31);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29._0_4_ >> 0x10 & 1) != 0) {
        acStack_2657[lVar4 + 1] = (char)iVar2 + '\x02';
      }
      auVar29 = pshufhw(auVar31,auVar31,0x84);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29._0_4_ >> 0x18 & 1) != 0) {
        acStack_2657[lVar4 + 2] = (char)iVar2 + '\x03';
      }
      auVar29 = auVar15 ^ _DAT_00539e70;
      iVar3 = auVar29._0_4_;
      iVar38 = auVar29._8_4_;
      auVar49._4_4_ = iVar3;
      auVar49._0_4_ = iVar3;
      auVar49._8_4_ = iVar38;
      auVar49._12_4_ = iVar38;
      auVar65._0_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar65._4_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar65._8_4_ = -(uint)(iVar38 < -0x7ffffa88);
      auVar65._12_4_ = -(uint)(iVar38 < -0x7ffffa88);
      auVar32._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar32._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar32._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar32._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar32 = auVar32 & auVar65;
      auVar29 = pshuflw(auVar49,auVar32,0xe8);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        acStack_2657[lVar4 + 3] = (char)iVar2 + '\x04';
      }
      auVar29 = packssdw(auVar32,auVar32);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29._4_2_ >> 8 & 1) != 0) {
        acStack_2657[lVar4 + 4] = (char)iVar2 + '\x05';
      }
      auVar29 = auVar13 ^ _DAT_00539e70;
      iVar3 = auVar29._0_4_;
      iVar38 = auVar29._8_4_;
      auVar50._4_4_ = iVar3;
      auVar50._0_4_ = iVar3;
      auVar50._8_4_ = iVar38;
      auVar50._12_4_ = iVar38;
      auVar66._0_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar66._4_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar66._8_4_ = -(uint)(iVar38 < -0x7ffffa88);
      auVar66._12_4_ = -(uint)(iVar38 < -0x7ffffa88);
      auVar33._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar33._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar33._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar33._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar33 = auVar33 & auVar66;
      auVar29 = packssdw(auVar50,auVar33);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        acStack_2657[lVar4 + 5] = (char)iVar2 + '\x06';
      }
      auVar29 = pshufhw(auVar33,auVar33,0x84);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29._6_2_ >> 8 & 1) != 0) {
        acStack_2657[lVar4 + 6] = (char)iVar2 + '\a';
      }
      auVar29 = auVar11 ^ _DAT_00539e70;
      iVar3 = auVar29._0_4_;
      iVar38 = auVar29._8_4_;
      auVar51._4_4_ = iVar3;
      auVar51._0_4_ = iVar3;
      auVar51._8_4_ = iVar38;
      auVar51._12_4_ = iVar38;
      auVar67._0_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar67._4_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar67._8_4_ = -(uint)(iVar38 < -0x7ffffa88);
      auVar67._12_4_ = -(uint)(iVar38 < -0x7ffffa88);
      auVar34._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar34._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar34._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar34._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar34 = auVar34 & auVar67;
      auVar29 = pshuflw(auVar51,auVar34,0xe8);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2650 + lVar4) = (char)iVar2 + '\b';
      }
      auVar29 = packssdw(auVar34,auVar34);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29._8_2_ >> 8 & 1) != 0) {
        *(char *)((long)&local_2650 + lVar4 + 1) = (char)iVar2 + '\t';
      }
      auVar29 = auVar9 ^ _DAT_00539e70;
      iVar3 = auVar29._0_4_;
      iVar38 = auVar29._8_4_;
      auVar52._4_4_ = iVar3;
      auVar52._0_4_ = iVar3;
      auVar52._8_4_ = iVar38;
      auVar52._12_4_ = iVar38;
      auVar68._0_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar68._4_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar68._8_4_ = -(uint)(iVar38 < -0x7ffffa88);
      auVar68._12_4_ = -(uint)(iVar38 < -0x7ffffa88);
      auVar35._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar35._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar35._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar35._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar35 = auVar35 & auVar68;
      auVar29 = packssdw(auVar52,auVar35);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2650 + lVar4 + 2) = (char)iVar2 + '\n';
      }
      auVar29 = pshufhw(auVar35,auVar35,0x84);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29._10_2_ >> 8 & 1) != 0) {
        *(char *)((long)&local_2650 + lVar4 + 3) = (char)iVar2 + '\v';
      }
      auVar29 = auVar7 ^ _DAT_00539e70;
      iVar3 = auVar29._0_4_;
      iVar38 = auVar29._8_4_;
      auVar53._4_4_ = iVar3;
      auVar53._0_4_ = iVar3;
      auVar53._8_4_ = iVar38;
      auVar53._12_4_ = iVar38;
      auVar69._0_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar69._4_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar69._8_4_ = -(uint)(iVar38 < -0x7ffffa88);
      auVar69._12_4_ = -(uint)(iVar38 < -0x7ffffa88);
      auVar36._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar36._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar36._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar36._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar36 = auVar36 & auVar69;
      auVar29 = pshuflw(auVar53,auVar36,0xe8);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2650 + lVar4 + 4) = (char)iVar2 + '\f';
      }
      auVar29 = packssdw(auVar36,auVar36);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29._12_2_ >> 8 & 1) != 0) {
        *(char *)((long)&local_2650 + lVar4 + 5) = (char)iVar2 + '\r';
      }
      auVar29 = auVar20 ^ _DAT_00539e70;
      iVar3 = auVar29._0_4_;
      iVar38 = auVar29._8_4_;
      auVar54._4_4_ = iVar3;
      auVar54._0_4_ = iVar3;
      auVar54._8_4_ = iVar38;
      auVar54._12_4_ = iVar38;
      auVar70._0_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar70._4_4_ = -(uint)(iVar3 < -0x7ffffa88);
      auVar70._8_4_ = -(uint)(iVar38 < -0x7ffffa88);
      auVar70._12_4_ = -(uint)(iVar38 < -0x7ffffa88);
      auVar37._0_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar37._4_4_ = -(uint)(auVar29._4_4_ == -0x80000000);
      auVar37._8_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar37._12_4_ = -(uint)(auVar29._12_4_ == -0x80000000);
      auVar37 = auVar37 & auVar70;
      auVar29 = packssdw(auVar54,auVar37);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)((long)&local_2650 + lVar4 + 6) = (char)iVar2 + '\x0e';
      }
      auVar29 = pshufhw(auVar37,auVar37,0x84);
      auVar29 = packssdw(auVar29,auVar29);
      auVar29 = packsswb(auVar29,auVar29);
      if ((auVar29._14_2_ >> 8 & 1) != 0) {
        *(char *)((long)&local_2650 + lVar4 + 7) = (char)iVar2 + '\x0f';
      }
      lVar4 = lVar4 + 0x10;
      lVar5 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 0x10;
      auVar19._8_8_ = lVar5 + 0x10;
      lVar5 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 0x10;
      auVar17._8_8_ = lVar5 + 0x10;
      lVar5 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 0x10;
      auVar15._8_8_ = lVar5 + 0x10;
      lVar5 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 0x10;
      auVar13._8_8_ = lVar5 + 0x10;
      lVar5 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 0x10;
      auVar11._8_8_ = lVar5 + 0x10;
      lVar5 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 0x10;
      auVar9._8_8_ = lVar5 + 0x10;
      lVar5 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 0x10;
      auVar7._8_8_ = lVar5 + 0x10;
      lVar5 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 0x10;
      auVar20._8_8_ = lVar5 + 0x10;
    } while (lVar4 != 0x580);
    HRSS_marshal_public_key((uint8_t *)local_1128,&local_cb0);
    iVar3 = HRSS_parse_public_key((HRSS_public_key *)local_16b8,(uint8_t *)local_1128);
    local_2678[0] = (internal)(iVar3 != 0);
    local_2670[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar3 == 0) {
      testing::Message::Message((Message *)&local_2698);
      this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_2670;
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1b38,local_2678,
                 (AssertionResult *)"HRSS_parse_public_key(&pub2, pub_bytes)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_26c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                 ,0x9c,(char *)local_1b38._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_26c0,(Message *)&local_2698);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_26c0);
      if ((AssertHelperData *)local_1b38._0_8_ != (AssertHelperData *)(local_1b38 + 0x10)) {
        operator_delete((void *)local_1b38._0_8_,local_1b38._16_8_ + 1);
      }
      __ptr_00 = local_2670[0];
      if ((long *)local_2698._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_2698._M_dataplus._M_p + 8))();
        __ptr_00 = local_2670[0];
      }
    }
    else {
      iVar3 = HRSS_encap(local_1b38,(uint8_t *)local_2678,(HRSS_public_key *)local_16b8,
                         (uint8_t *)&local_2658);
      local_26c0[0] = (internal)(iVar3 != 0);
      local_26b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar3 == 0) {
        testing::Message::Message((Message *)local_26e0);
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_26b8;
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_2698,(internal *)local_26c0,
                   (AssertionResult *)"HRSS_encap(ciphertext, shared_key, &pub2, encap_entropy)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_26d0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,0xa0,local_2698._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&local_26d0,(Message *)local_26e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_26d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2698._M_dataplus._M_p != &local_2698.field_2) {
          operator_delete(local_2698._M_dataplus._M_p,local_2698.field_2._M_allocated_capacity + 1);
        }
        __ptr_00 = local_26b8;
        if (local_26e0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_26e0 + 8))();
          __ptr_00 = local_26b8;
        }
      }
      else {
        iVar3 = HRSS_decap((uint8_t *)&local_2698,&local_720,local_1b38,0x472);
        local_26e0[0] = iVar3 != 0;
        local_26d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar3 != 0) {
          local_26d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &DAT_00000020;
          local_26d0.span_.size_ = 0x20;
          local_26e0 = (undefined1  [8])local_2678;
          local_26d0.span_.data_ = (uchar *)&local_2698;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)local_26c0,"Bytes(shared_key)","Bytes(shared_key2)",
                     (Bytes *)local_26e0,&local_26d0);
          if (local_26c0[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_26e0);
            if (local_26b8 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              message = "";
            }
            else {
              message = (local_26b8->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_26d0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                       ,0xa5,message);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_26d0,(Message *)local_26e0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_26d0);
            if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )local_26e0 !=
                (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )0x0) {
              (**(code **)(*(long *)local_26e0 + 8))();
            }
          }
          if (local_26b8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
             ) {
            return;
          }
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_26b8;
          __ptr_00 = local_26b8;
          goto LAB_0030a1fe;
        }
        testing::Message::Message((Message *)&local_26d0);
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_26d8;
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_26c0,(internal *)local_26e0,
                   (AssertionResult *)
                   "HRSS_decap(shared_key2, &priv, ciphertext, sizeof(ciphertext))","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_26a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss_test.cc"
                   ,0xa3,(char *)CONCAT71(local_26c0._1_7_,local_26c0[0]));
        testing::internal::AssertHelper::operator=(&local_26a0,(Message *)&local_26d0);
        testing::internal::AssertHelper::~AssertHelper(&local_26a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_26c0._1_7_,local_26c0[0]) != &local_26b0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_26c0._1_7_,local_26c0[0]),
                          local_26b0._M_allocated_capacity + 1);
        }
        __ptr_00 = local_26d8;
        if ((string *)local_26d0.span_.data_ != (string *)0x0) {
          (**(code **)(((_Alloc_hider *)local_26d0.span_.data_)->_M_p + 8))();
          __ptr_00 = local_26d8;
        }
      }
    }
  }
  if (__ptr_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
LAB_0030a1fe:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
  return;
}

Assistant:

TEST(HRSS, Basic) {
  uint8_t generate_key_entropy[HRSS_GENERATE_KEY_BYTES];
  for (unsigned i = 0; i < sizeof(generate_key_entropy); i++) {
    generate_key_entropy[i] = i;
  }

  HRSS_public_key pub;
  HRSS_private_key priv;
  ASSERT_TRUE(HRSS_generate_key(&pub, &priv, generate_key_entropy));

  uint8_t encap_entropy[HRSS_ENCAP_BYTES];
  for (unsigned i = 0; i < sizeof(encap_entropy); i++) {
    encap_entropy[i] = i;
  }

  HRSS_public_key pub2;
  uint8_t pub_bytes[HRSS_PUBLIC_KEY_BYTES];
  HRSS_marshal_public_key(pub_bytes, &pub);
  ASSERT_TRUE(HRSS_parse_public_key(&pub2, pub_bytes));

  uint8_t ciphertext[HRSS_CIPHERTEXT_BYTES];
  uint8_t shared_key[HRSS_KEY_BYTES];
  ASSERT_TRUE(HRSS_encap(ciphertext, shared_key, &pub2, encap_entropy));

  uint8_t shared_key2[HRSS_KEY_BYTES];
  ASSERT_TRUE(HRSS_decap(shared_key2, &priv, ciphertext, sizeof(ciphertext)));

  EXPECT_EQ(Bytes(shared_key), Bytes(shared_key2));
}